

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

void __thiscall cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++(iterator *this)

{
  cmLinkedTree<cmState::PolicyStackEntry> *pcVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmState::PolicyStackEntry> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x41,
                  "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
                 );
  }
  puVar2 = (pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(pcVar1->Data).
                 super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pcVar1->Data).
                 super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if ((long)(pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3 != uVar4) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x42,
                  "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
                 );
  }
  uVar3 = this->Position;
  if (uVar4 < uVar3) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x43,
                  "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
                 );
  }
  if (uVar3 != 0) {
    this->Position = puVar2[uVar3 - 1];
    return;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0x44,
                "void cmLinkedTree<cmState::PolicyStackEntry>::iterator::operator++() [T = cmState::PolicyStackEntry]"
               );
}

Assistant:

void operator++()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      this->Position = this->Tree->UpPositions[this->Position - 1];
    }